

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O3

void __thiscall
CoreML::NeuralNetworkShaper::NeuralNetworkShaper
          (NeuralNetworkShaper *this,ModelDescription *interface,
          RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *layers,
          bool useInputAndOutputConstraints)

{
  _Rb_tree_header *p_Var1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this_00;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  __first2;
  bool bVar2;
  _Self __tmp;
  Type *pTVar3;
  mapped_type *pmVar4;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this_01;
  Type *pTVar5;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  _Var6;
  iterator iVar7;
  ArrayFeatureType *pAVar8;
  LogMessage *pLVar9;
  ImageFeatureType *pIVar10;
  int64 *piVar11;
  undefined7 in_register_00000009;
  size_t val;
  int iVar12;
  int iVar13;
  FeatureType *pFVar14;
  bool bVar15;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  blobColorsCopy;
  LogFinisher local_91;
  ModelDescription *local_90;
  undefined4 local_84;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  *local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *local_78;
  LogMessage local_70;
  _Base_ptr local_38;
  
  local_84 = (undefined4)CONCAT71(in_register_00000009,useInputAndOutputConstraints);
  iVar13 = (interface->input_).super_RepeatedPtrFieldBase.current_size_;
  this->numColors = iVar13;
  local_78 = &this->blobColors;
  p_Var1 = &(this->blobColors)._M_t._M_impl.super__Rb_tree_header;
  (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80 = &this->blobShapes;
  local_38 = &(this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_38;
  (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_38;
  (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70.level_ = LOGLEVEL_INFO;
  local_90 = interface;
  if (0 < iVar13) {
    do {
      pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&(interface->input_).super_RepeatedPtrFieldBase,local_70.level_);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
               ::operator[](local_80,(pTVar3->name_).ptr_);
      ShapeConstraint::setName(pmVar4,(pTVar3->name_).ptr_);
      this_01 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                ::operator[](local_78,(pTVar3->name_).ptr_);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>(this_01,(int *)&local_70);
      if ((char)local_84 != '\0') {
        pFVar14 = pTVar3->type_;
        if (pFVar14 == (FeatureType *)0x0) {
          pFVar14 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        ShapeConstraint::updateConstraint(pmVar4,pFVar14);
      }
      local_70.level_ = local_70.level_ + LOGLEVEL_WARNING;
    } while ((int)local_70.level_ < (local_90->input_).super_RepeatedPtrFieldBase.current_size_);
  }
  do {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                *)&local_70,&local_78->_M_t);
    iVar13 = (layers->super_RepeatedPtrFieldBase).current_size_;
    if (0 < iVar13) {
      iVar12 = 0;
      do {
        pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                           (&layers->super_RepeatedPtrFieldBase,iVar12);
        PassColorsDown(this,pTVar5);
        ProcessLayer(this,pTVar5);
        iVar12 = iVar12 + 1;
        iVar13 = (layers->super_RepeatedPtrFieldBase).current_size_;
      } while (iVar12 < iVar13);
    }
    while (0 < iVar13) {
      iVar13 = iVar13 + -1;
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                         (&layers->super_RepeatedPtrFieldBase,iVar13);
      PassColorsUp(this,pTVar5);
      ProcessLayer(this,pTVar5);
    }
    __first2._M_node = (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)__first2._M_node == p_Var1) {
      bVar15 = true;
    }
    else {
      iVar13 = this->numColors;
      _Var6._M_node = __first2._M_node;
      do {
        bVar15 = iVar13 == *(int *)&_Var6._M_node[3]._M_parent;
        if (!bVar15) break;
        _Var6._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var6._M_node);
      } while ((_Rb_tree_header *)_Var6._M_node != p_Var1);
    }
    if (local_70.message_.field_2._M_allocated_capacity ==
        (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      bVar2 = std::__equal<false>::
              equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::set<int,std::less<int>,std::allocator<int>>>>>
                        ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                          )local_70.message_._M_dataplus._M_p,
                         (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                          )&local_70.filename_,__first2);
    }
    else {
      bVar2 = false;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                 *)&local_70);
  } while (!bVar15 && bVar2 == false);
  if (((char)local_84 != '\0') && (0 < (local_90->output_).super_RepeatedPtrFieldBase.current_size_)
     ) {
    this_00 = &local_90->output_;
    iVar13 = 0;
    do {
      pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar13);
      iVar12 = std::__cxx11::string::compare((string *)(pTVar3->name_).ptr_);
      if (((iVar12 != 0) &&
          (iVar12 = std::__cxx11::string::compare((string *)(pTVar3->name_).ptr_), iVar12 != 0)) &&
         (iVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
                  ::find(&local_80->_M_t,(pTVar3->name_).ptr_), iVar7._M_node != local_38)) {
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
                 ::at(local_80,(pTVar3->name_).ptr_);
        pFVar14 = pTVar3->type_;
        if (pFVar14 == (FeatureType *)0x0) {
          pFVar14 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        if (pFVar14->_oneof_case_[0] == 5) {
          pAVar8 = (ArrayFeatureType *)(pFVar14->Type_).int64type_;
LAB_0027a698:
          pFVar14 = pTVar3->type_;
          if (pFVar14 == (FeatureType *)0x0) {
            pFVar14 = (FeatureType *)&Specification::_FeatureType_default_instance_;
          }
          if ((pAVar8->shape_).current_size_ == 3) {
            if (pFVar14->_oneof_case_[0] == 5) {
              pAVar8 = (pFVar14->Type_).multiarraytype_;
            }
            else {
              pAVar8 = Specification::ArrayFeatureType::default_instance();
            }
            if ((pAVar8->shape_).current_size_ < 1) {
              google::protobuf::internal::LogMessage::LogMessage
                        (&local_70,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                         ,0x476);
              pLVar9 = google::protobuf::internal::LogMessage::operator<<
                                 (&local_70,"CHECK failed: (index) < (current_size_): ");
              google::protobuf::internal::LogFinisher::operator=(&local_91,pLVar9);
              google::protobuf::internal::LogMessage::~LogMessage(&local_70);
            }
            ShapeConstraint::setChannel(pmVar4,((pAVar8->shape_).rep_)->elements[0]);
            pFVar14 = pTVar3->type_;
            if (pFVar14 == (FeatureType *)0x0) {
              pFVar14 = (FeatureType *)&Specification::_FeatureType_default_instance_;
            }
            if (pFVar14->_oneof_case_[0] == 5) {
              pAVar8 = (pFVar14->Type_).multiarraytype_;
            }
            else {
              pAVar8 = Specification::ArrayFeatureType::default_instance();
            }
            if ((pAVar8->shape_).current_size_ < 2) {
              google::protobuf::internal::LogMessage::LogMessage
                        (&local_70,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                         ,0x476);
              pLVar9 = google::protobuf::internal::LogMessage::operator<<
                                 (&local_70,"CHECK failed: (index) < (current_size_): ");
              google::protobuf::internal::LogFinisher::operator=(&local_91,pLVar9);
              google::protobuf::internal::LogMessage::~LogMessage(&local_70);
            }
            ShapeConstraint::setHeight(pmVar4,(size_t)(pAVar8->shape_).rep_[1].arena);
            pFVar14 = pTVar3->type_;
            if (pFVar14 == (FeatureType *)0x0) {
              pFVar14 = (FeatureType *)&Specification::_FeatureType_default_instance_;
            }
            if (pFVar14->_oneof_case_[0] == 5) {
              pAVar8 = (pFVar14->Type_).multiarraytype_;
            }
            else {
              pAVar8 = Specification::ArrayFeatureType::default_instance();
            }
            if ((pAVar8->shape_).current_size_ < 3) {
              google::protobuf::internal::LogMessage::LogMessage
                        (&local_70,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                         ,0x476);
              pLVar9 = google::protobuf::internal::LogMessage::operator<<
                                 (&local_70,"CHECK failed: (index) < (current_size_): ");
              google::protobuf::internal::LogFinisher::operator=(&local_91,pLVar9);
              google::protobuf::internal::LogMessage::~LogMessage(&local_70);
            }
            piVar11 = (pAVar8->shape_).rep_[1].elements;
            goto LAB_0027a87c;
          }
          if (pFVar14->_oneof_case_[0] == 5) {
            pAVar8 = (ArrayFeatureType *)(pFVar14->Type_).int64type_;
          }
          else {
            pAVar8 = Specification::ArrayFeatureType::default_instance();
          }
          if ((pAVar8->shape_).current_size_ != 1) goto LAB_0027a8ff;
          pFVar14 = pTVar3->type_;
          if (pFVar14 == (FeatureType *)0x0) {
            pFVar14 = (FeatureType *)&Specification::_FeatureType_default_instance_;
          }
          if (pFVar14->_oneof_case_[0] == 5) {
            pAVar8 = (pFVar14->Type_).multiarraytype_;
          }
          else {
            pAVar8 = Specification::ArrayFeatureType::default_instance();
          }
          if ((pAVar8->shape_).current_size_ < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      (&local_70,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x476);
            pLVar9 = google::protobuf::internal::LogMessage::operator<<
                               (&local_70,"CHECK failed: (index) < (current_size_): ");
            google::protobuf::internal::LogFinisher::operator=(&local_91,pLVar9);
            google::protobuf::internal::LogMessage::~LogMessage(&local_70);
          }
          ShapeConstraint::setChannel(pmVar4,((pAVar8->shape_).rep_)->elements[0]);
          val = 1;
          ShapeConstraint::setHeight(pmVar4,1);
        }
        else {
          if (pFVar14->_oneof_case_[0] != 4) {
            pAVar8 = Specification::ArrayFeatureType::default_instance();
            goto LAB_0027a698;
          }
          ShapeConstraint::setChannel
                    (pmVar4,(ulong)(((pFVar14->Type_).imagetype_)->colorspace_ != 10) * 2 + 1);
          pFVar14 = pTVar3->type_;
          if (pFVar14 == (FeatureType *)0x0) {
            pFVar14 = (FeatureType *)&Specification::_FeatureType_default_instance_;
          }
          if (pFVar14->_oneof_case_[0] == 4) {
            pIVar10 = (pFVar14->Type_).imagetype_;
          }
          else {
            pIVar10 = Specification::ImageFeatureType::default_instance();
          }
          ShapeConstraint::setHeight(pmVar4,pIVar10->height_);
          pFVar14 = pTVar3->type_;
          if (pFVar14 == (FeatureType *)0x0) {
            pFVar14 = (FeatureType *)&Specification::_FeatureType_default_instance_;
          }
          if (pFVar14->_oneof_case_[0] == 4) {
            pIVar10 = (pFVar14->Type_).imagetype_;
          }
          else {
            pIVar10 = Specification::ImageFeatureType::default_instance();
          }
          piVar11 = &pIVar10->width_;
LAB_0027a87c:
          val = *piVar11;
        }
        ShapeConstraint::setWidth(pmVar4,val);
      }
LAB_0027a8ff:
      iVar13 = iVar13 + 1;
    } while (iVar13 < (local_90->output_).super_RepeatedPtrFieldBase.current_size_);
  }
  return;
}

Assistant:

NeuralNetworkShaper::NeuralNetworkShaper(const Specification::ModelDescription& interface, const google::protobuf::RepeatedPtrField<Specification::NeuralNetworkLayer>& layers, bool useInputAndOutputConstraints)
    :
    numColors(interface.input().size())
{

    for (int i = 0; i < interface.input().size(); i++) {
        const Specification::FeatureDescription& desc = interface.input(i);

        ShapeConstraint& constraint = blobShapes[desc.name()];
        constraint.setName(desc.name());
        // Each input blob starts as it's own color
        blobColors[desc.name()].insert(i);

        if (useInputAndOutputConstraints) {
            constraint.updateConstraint(desc.type());
        }

    }

    bool done = false;

    while (!done) {

        std::map<std::string, std::set<int> > blobColorsCopy = blobColors;

#if COREML_VALIDATOR_VERBOSE
        std::cout << std::endl << "=====================" << std::endl << "Computing neural network shapes" << std::endl  << "=====================" << std::endl;
        std::cout << std::endl << "Starting forward computation of neural network shapes" << std::endl << std::endl;
#endif

        // forward pass
        for (int i = 0; i < layers.size(); i++){
            const Specification::NeuralNetworkLayer& layer = layers[i];
            PassColorsDown(layer);
            ProcessLayer(layer);
        } // loop over layers

#if COREML_VALIDATOR_VERBOSE
        std::cout << std::endl << std::endl << "Starting backward computation of neural network shapes" << std::endl << std::endl;
#endif

        // backward pass
        for (int i = layers.size() - 1; i >= 0; i--){
            const Specification::NeuralNetworkLayer& layer = layers[i];
            PassColorsUp(layer);
            ProcessLayer(layer);
        } // loop over layers

        done = AllShapesDone();

        if (blobColorsCopy == blobColors) {
            break;
        }
    }

    if (useInputAndOutputConstraints) {
        for (int i = 0; i < interface.output().size(); i++) {
            const Specification::FeatureDescription& desc = interface.output(i);

            // skip over names that are just for the classifier
            if (desc.name().compare(interface.predictedprobabilitiesname()) == 0
                || desc.name().compare(interface.predictedfeaturename()) == 0) {
                continue;
            }
            
            // using at because it needs to exist, this will throw if it doesn't
            if (blobShapes.find(desc.name()) == blobShapes.end()) {
                continue;
            }
            ShapeConstraint& constraint = blobShapes.at(desc.name());

            // TODO: add a catch with an error message that mentions the name

            if (desc.type().Type_case() == Specification::FeatureType::kImageType) {
                // sequence constraint here is unbounded
                // batch is unbounded
                // other three read from the constraint as is -- later to be updated with flexibility
                if (desc.type().imagetype().colorspace() == Specification::ImageFeatureType_ColorSpace_GRAYSCALE)
                    constraint.setChannel(1);
                else {
                    constraint.setChannel(3);
                }
                constraint.setHeight(static_cast<size_t>(desc.type().imagetype().height()));
                constraint.setWidth(static_cast<size_t>(desc.type().imagetype().width()));
            }
            else { // assuming it's a multi array

                // allowing for the possibility that output shapes aren't constrained
                if (desc.type().multiarraytype().shape_size() == 3) {
                    constraint.setChannel(static_cast<size_t>(desc.type().multiarraytype().shape(0)));
                    constraint.setHeight(static_cast<size_t>(desc.type().multiarraytype().shape(1)));
                    constraint.setWidth(static_cast<size_t>(desc.type().multiarraytype().shape(2)));
                }
                else if (desc.type().multiarraytype().shape_size() == 1) {
                    constraint.setChannel(static_cast<size_t>(desc.type().multiarraytype().shape(0)));
                    constraint.setHeight(1);
                    constraint.setWidth(1);
                }
            }
        }
    }

}